

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MatchTestTest.cpp
# Opt level: O1

void __thiscall MatchTestTest::MatchTestTest(MatchTestTest *this)

{
  TestText *pTVar1;
  undefined1 local_119;
  shared_ptr<const_oout::NamedTest> local_118;
  undefined1 local_108 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_100;
  undefined1 local_f8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f0;
  shared_ptr<oout::StringText> local_e8;
  shared_ptr<oout::MatchTest> local_d8;
  ContainMatch *local_c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c0;
  shared_ptr<oout::ContainMatch> local_b8;
  shared_ptr<oout::ContainMatch> local_a8;
  shared_ptr<oout::EqualTest> local_98;
  shared_ptr<const_oout::NamedTest> local_88;
  EqualMatch *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  shared_ptr<oout::EqualMatch> local_68;
  shared_ptr<oout::EqualTest> local_58;
  shared_ptr<const_oout::NamedTest> local_48;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"MatchTest test","");
  local_68.super___shared_ptr<oout::EqualMatch,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::StringText,std::allocator<oout::StringText>,char_const(&)[5]>
            (&local_68.super___shared_ptr<oout::EqualMatch,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (StringText **)&local_68,(allocator<oout::StringText> *)&local_118,
             (char (*) [5])0x17d264);
  local_78 = (EqualMatch *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::EqualMatch,std::allocator<oout::EqualMatch>,char_const(&)[5]>
            (&local_70,&local_78,(allocator<oout::EqualMatch> *)&local_118,(char (*) [5])0x17d264);
  std::
  make_unique<oout::MatchTest,std::shared_ptr<oout::StringText>,std::shared_ptr<oout::EqualMatch>>
            ((shared_ptr<oout::StringText> *)local_f8,&local_68);
  pTVar1 = (TestText *)operator_new(0x18);
  std::__shared_ptr<oout::Test_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<oout::MatchTest,std::default_delete<oout::MatchTest>,void>
            ((__shared_ptr<oout::Test_const,(__gnu_cxx::_Lock_policy)2> *)&local_118,
             (unique_ptr<oout::MatchTest,_std::default_delete<oout::MatchTest>_> *)local_f8);
  TestText::TestText(pTVar1,(shared_ptr<const_oout::Test> *)&local_118);
  local_f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pTVar1;
  if (local_118.super___shared_ptr<const_oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_118.super___shared_ptr<const_oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_58.super___shared_ptr<oout::EqualTest,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::EqualTest,std::allocator<oout::EqualTest>,std::unique_ptr<TestText,std::default_delete<TestText>>,char_const(&)[8]>
            (&local_58.super___shared_ptr<oout::EqualTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (EqualTest **)&local_58,(allocator<oout::EqualTest> *)&local_118,
             (unique_ptr<TestText,_std::default_delete<TestText>_> *)&local_f0,
             (char (*) [8])0x17da77);
  local_48.super___shared_ptr<const_oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::NamedTest_const,std::allocator<oout::NamedTest>,char_const(&)[45],std::shared_ptr<oout::EqualTest>>
            (&local_48.super___shared_ptr<const_oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(NamedTest **)&local_48,(allocator<oout::NamedTest> *)&local_118,
             (char (*) [45])"MatchTest success with success equal matcher",&local_58);
  local_a8.super___shared_ptr<oout::ContainMatch,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::StringText,std::allocator<oout::StringText>,char_const(&)[5]>
            (&local_a8.super___shared_ptr<oout::ContainMatch,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(StringText **)&local_a8,(allocator<oout::StringText> *)&local_118,
             (char (*) [5])0x17d264);
  local_b8.super___shared_ptr<oout::ContainMatch,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::ContainMatch,std::allocator<oout::ContainMatch>,char_const(&)[3]>
            (&local_b8.super___shared_ptr<oout::ContainMatch,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(ContainMatch **)&local_b8,(allocator<oout::ContainMatch> *)&local_118,
             (char (*) [3])0x17d4a7);
  local_c8 = (ContainMatch *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::ContainMatch,std::allocator<oout::ContainMatch>,char_const(&)[3]>
            (&local_c0,&local_c8,(allocator<oout::ContainMatch> *)&local_118,(char (*) [3])0x17c87a)
  ;
  std::
  make_unique<oout::MatchTest,std::shared_ptr<oout::StringText>,std::shared_ptr<oout::ContainMatch>,std::shared_ptr<oout::ContainMatch>>
            ((shared_ptr<oout::StringText> *)local_108,&local_a8,&local_b8);
  pTVar1 = (TestText *)operator_new(0x18);
  std::__shared_ptr<oout::Test_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<oout::MatchTest,std::default_delete<oout::MatchTest>,void>
            ((__shared_ptr<oout::Test_const,(__gnu_cxx::_Lock_policy)2> *)&local_118,
             (unique_ptr<oout::MatchTest,_std::default_delete<oout::MatchTest>_> *)local_108);
  TestText::TestText(pTVar1,(shared_ptr<const_oout::Test> *)&local_118);
  local_100._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pTVar1;
  if (local_118.super___shared_ptr<const_oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_118.super___shared_ptr<const_oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_98.super___shared_ptr<oout::EqualTest,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::EqualTest,std::allocator<oout::EqualTest>,std::unique_ptr<TestText,std::default_delete<TestText>>,char_const(&)[8]>
            (&local_98.super___shared_ptr<oout::EqualTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (EqualTest **)&local_98,(allocator<oout::EqualTest> *)&local_118,
             (unique_ptr<TestText,_std::default_delete<TestText>_> *)&local_100,
             (char (*) [8])0x17da77);
  local_88.super___shared_ptr<const_oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::NamedTest_const,std::allocator<oout::NamedTest>,char_const(&)[43],std::shared_ptr<oout::EqualTest>>
            (&local_88.super___shared_ptr<const_oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(NamedTest **)&local_88,(allocator<oout::NamedTest> *)&local_118,
             (char (*) [43])"MatchTest success with all success matcher",&local_98);
  local_e8.super___shared_ptr<oout::StringText,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::StringText,std::allocator<oout::StringText>,char_const(&)[5]>
            (&local_e8.super___shared_ptr<oout::StringText,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (StringText **)&local_e8,(allocator<oout::StringText> *)&local_119,
             (char (*) [5])0x17d264);
  local_d8.super___shared_ptr<oout::MatchTest,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::MatchTest,std::allocator<oout::MatchTest>,std::shared_ptr<oout::StringText>,char_const(&)[5]>
            (&local_d8.super___shared_ptr<oout::MatchTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (MatchTest **)&local_d8,(allocator<oout::MatchTest> *)&local_119,&local_e8,
             (char (*) [5])0x17d264);
  local_118.super___shared_ptr<const_oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::NamedTest_const,std::allocator<oout::NamedTest>,char_const(&)[33],std::shared_ptr<oout::MatchTest>>
            (&local_118.super___shared_ptr<const_oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(NamedTest **)&local_118,(allocator<oout::NamedTest> *)&local_119,
             (char (*) [33])"MatchTest check equal by default",&local_d8);
  oout::dirty::Test::
  Test<std::shared_ptr<oout::NamedTest_const>,std::shared_ptr<oout::NamedTest_const>,std::shared_ptr<oout::NamedTest_const>>
            (&this->super_Test,&local_38,&local_48,&local_88,&local_118);
  if (local_118.super___shared_ptr<const_oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_118.super___shared_ptr<const_oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_d8.super___shared_ptr<oout::MatchTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d8.super___shared_ptr<oout::MatchTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_e8.super___shared_ptr<oout::StringText,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e8.super___shared_ptr<oout::StringText,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  if (local_88.super___shared_ptr<const_oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.super___shared_ptr<const_oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_98.super___shared_ptr<oout::EqualTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.super___shared_ptr<oout::EqualTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if ((TestText *)local_100._M_pi != (TestText *)0x0) {
    std::default_delete<TestText>::operator()
              ((default_delete<TestText> *)&local_100,(TestText *)local_100._M_pi);
  }
  local_100._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((_Tuple_impl<0UL,_oout::MatchTest_*,_std::default_delete<oout::MatchTest>_>)local_108 !=
      (MatchTest *)0x0) {
    std::default_delete<oout::MatchTest>::operator()
              ((default_delete<oout::MatchTest> *)local_108,(MatchTest *)local_108);
  }
  local_108 = (undefined1  [8])0x0;
  if (local_c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0._M_pi);
  }
  if (local_b8.super___shared_ptr<oout::ContainMatch,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8.super___shared_ptr<oout::ContainMatch,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_a8.super___shared_ptr<oout::ContainMatch,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a8.super___shared_ptr<oout::ContainMatch,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_48.super___shared_ptr<const_oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<const_oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_58.super___shared_ptr<oout::EqualTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super___shared_ptr<oout::EqualTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if ((TestText *)local_f0._M_pi != (TestText *)0x0) {
    std::default_delete<TestText>::operator()
              ((default_delete<TestText> *)&local_f0,(TestText *)local_f0._M_pi);
  }
  local_f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (local_f8 != (undefined1  [8])0x0) {
    std::default_delete<oout::MatchTest>::operator()
              ((default_delete<oout::MatchTest> *)local_f8,(MatchTest *)local_f8);
  }
  local_f8 = (undefined1  [8])0x0;
  if (local_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70._M_pi);
  }
  if (local_68.super___shared_ptr<oout::EqualMatch,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.super___shared_ptr<oout::EqualMatch,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  (this->super_Test).super_Test._vptr_Test = (_func_int **)&PTR__Test_00198470;
  return;
}

Assistant:

MatchTestTest::MatchTestTest()
: dirty::Test(
	"MatchTest test",
	make_shared<const NamedTest>(
		"MatchTest success with success equal matcher",
		make_shared<EqualTest>(
			make_unique<TestText>(
				make_unique<MatchTest>(
					make_shared<StringText>("test"),
					make_shared<EqualMatch>("test")
				)
			),
			"success"
		)
	),
	make_shared<const NamedTest>(
		"MatchTest success with all success matcher",
		make_shared<EqualTest>(
			make_unique<TestText>(
				make_unique<MatchTest>(
					make_shared<StringText>("test"),
					make_shared<ContainMatch>("te"),
					make_shared<ContainMatch>("st")
				)
			),
			"success"
		)
	),
	make_shared<const NamedTest>(
		"MatchTest check equal by default",
		make_shared<MatchTest>(
			make_shared<StringText>("test"),
			"test"
		)
	)
)
{
}